

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

object * gcialloc(int sz)

{
  object *poVar1;
  uint uVar2;
  
  uVar2 = sz + 0xe;
  if (-1 < (int)(sz + 7U)) {
    uVar2 = sz + 7U;
  }
  poVar1 = (object *)((long)&memoryPointer->header + (long)(int)(-0x10 - (uVar2 & 0xfffffff8)));
  memoryPointer = poVar1;
  if ((long)poVar1 < (long)memoryBase) {
    poVar1 = gcollect((int)uVar2 >> 3);
  }
  else {
    poVar1->header = (ulong)(uint)(((int)uVar2 >> 3) << 2);
  }
  poVar1->header = (ulong)(sz * 4 + 2);
  return poVar1;
}

Assistant:

struct object *gcialloc(int sz)
{
    int trueSize;
    struct object *result;

    trueSize = TO_WORDS(sz);
    result = gcalloc(trueSize);
    SET_SIZE(result, sz);
    SET_BINOBJ(result);
    return result;
}